

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O0

Result Wasm2cMain(Errors *errors)

{
  Stream *h_impl_stream_00;
  initializer_list<wabt::Stream_*> __l;
  pointer errors_00;
  bool bVar1;
  Result result;
  char *pcVar2;
  pointer log_stream;
  uchar *data;
  size_type size;
  ulong uVar3;
  reference ppSVar4;
  char *header_impl_name_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  undefined1 auVar5 [16];
  string_view sVar6;
  allocator<wabt::Stream_*> local_869;
  Stream *local_868;
  iterator local_860;
  size_type local_858;
  vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> local_850;
  Enum local_834;
  undefined1 local_830 [8];
  FileStream stream;
  string local_7f0 [39];
  allocator<char> local_7c9;
  string local_7c8 [36];
  Enum local_7a4;
  undefined1 local_7a0 [16];
  undefined1 local_790 [8];
  string_view header_impl_name;
  undefined1 local_770 [8];
  FileStream h_impl_stream;
  string_view local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  undefined1 local_6f0 [8];
  string header_impl_name_full;
  string local_6c8 [36];
  Enum local_6a4;
  undefined1 local_6a0 [16];
  string_view local_690;
  string_view local_680;
  string_view local_670;
  undefined1 local_660 [16];
  undefined1 local_650 [8];
  string_view header_name;
  undefined1 local_630 [8];
  FileStream h_stream;
  FileStream *s;
  iterator __end2;
  iterator __begin2;
  vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> *__range2;
  vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> c_stream_ptrs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  uint local_538;
  allocator<char> local_531;
  uint i;
  undefined8 local_528;
  string_view local_520;
  undefined1 local_510 [8];
  string output_prefix;
  undefined1 local_4e8 [8];
  vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> c_streams;
  string_view local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [8];
  string header_name_full;
  ValidateOptions local_45b;
  Enum local_448;
  Enum local_444;
  undefined1 local_440 [8];
  ReadBinaryOptions options;
  undefined1 local_410 [6];
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  Module module;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  Enum local_34;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors *errors_local;
  
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)errors;
  if (s_num_outputs == 0) {
    fprintf(_stderr,"Number of output files must be positive.\n");
    wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
    goto LAB_0013371d;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,pcVar2);
  sVar6._M_str = local_30;
  sVar6._M_len = (size_t)local_48._M_str;
  local_34 = (Enum)wabt::ReadFile((wabt *)local_48._M_len,sVar6,in_RCX);
  bVar1 = wabt::Failed((Result)local_34);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
    module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  else {
    wabt::Module::Module((Module *)local_410);
    options._39_1_ = 1;
    options._38_1_ = 1;
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_440,&s_write_c_options.features,&log_stream->super_Stream,
               (bool)(s_read_debug_names & 1),true,true);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    local_444 = (Enum)wabt::ReadBinaryIr(pcVar2,data,size,(ReadBinaryOptions *)local_440,
                                         (Errors *)
                                         file_data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (Module *)local_410);
    bVar1 = wabt::Failed((Result)local_444);
    errors_00 = file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
      module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    }
    else {
      wabt::ValidateOptions::ValidateOptions(&local_45b,&s_write_c_options.features);
      local_448 = (Enum)wabt::ValidateModule((Module *)local_410,(Errors *)errors_00,&local_45b);
      bVar1 = wabt::Failed((Result)local_448);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
        module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      }
      else {
        result = wabt::GenerateNames((Module *)local_410,None);
        bVar1 = wabt::Failed(result);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
          module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
        }
        else {
          header_name_full.field_2._12_4_ = wabt::ApplyNames((Module *)local_410);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)&s_outfile_abi_cxx11_);
            filename._M_str = auVar5._8_8_;
            filename._M_len = (size_t)filename._M_str;
            local_4b8 = wabt::StripExtension(auVar5._0_8_,filename);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&local_4a8,&local_4b8,
                       (allocator<char> *)
                       ((long)&c_streams.
                               super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488,&local_4a8,".h");
            std::__cxx11::string::~string((string *)&local_4a8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&c_streams.
                               super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::vector
                      ((vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> *)local_4e8);
            if (s_num_outputs == 1) {
              output_prefix.field_2._8_8_ = std::__cxx11::string::c_str();
              std::vector<wabt::FileStream,std::allocator<wabt::FileStream>>::
              emplace_back<char_const*>
                        ((vector<wabt::FileStream,std::allocator<wabt::FileStream>> *)local_4e8,
                         (char **)((long)&output_prefix.field_2 + 8));
            }
            else {
              _i = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&s_outfile_abi_cxx11_);
              filename_00._M_str = i._8_8_;
              filename_00._M_len = (size_t)filename_00._M_str;
              local_520 = wabt::StripExtension((wabt *)i,filename_00);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)local_510,&local_520,&local_531);
              std::allocator<char>::~allocator(&local_531);
              for (local_538 = 0; local_538 < s_num_outputs; local_538 = local_538 + 1) {
                std::operator+(&local_598,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_510,"_");
                std::__cxx11::to_string
                          ((string *)
                           &c_stream_ptrs.
                            super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_538);
                std::operator+(&local_578,&local_598,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &c_stream_ptrs.
                                super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                std::operator+(&local_558,&local_578,".c");
                std::vector<wabt::FileStream,std::allocator<wabt::FileStream>>::
                emplace_back<std::__cxx11::string>
                          ((vector<wabt::FileStream,std::allocator<wabt::FileStream>> *)local_4e8,
                           &local_558);
                std::__cxx11::string::~string((string *)&local_558);
                std::__cxx11::string::~string((string *)&local_578);
                std::__cxx11::string::~string
                          ((string *)
                           &c_stream_ptrs.
                            super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::string::~string((string *)&local_598);
              }
              std::__cxx11::string::~string((string *)local_510);
            }
            std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::vector
                      ((vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> *)&__range2);
            __end2 = std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::begin
                               ((vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> *)
                                local_4e8);
            s = (FileStream *)
                std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::end
                          ((vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> *)local_4e8)
            ;
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                (&__end2,(__normal_iterator<wabt::FileStream_*,_std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>_>
                                          *)&s);
              if (!bVar1) break;
              h_stream._48_8_ =
                   __gnu_cxx::
                   __normal_iterator<wabt::FileStream_*,_std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>_>
                   ::operator*(&__end2);
              std::vector<wabt::Stream*,std::allocator<wabt::Stream*>>::
              emplace_back<wabt::FileStream*>
                        ((vector<wabt::Stream*,std::allocator<wabt::Stream*>> *)&__range2,
                         (FileStream **)&h_stream.should_close_);
              __gnu_cxx::
              __normal_iterator<wabt::FileStream_*,_std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>_>
              ::operator++(&__end2);
            }
            sVar6 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_488);
            header_name._M_str = (char *)sVar6._M_len;
            wabt::FileStream::FileStream((FileStream *)local_630,sVar6,(Stream *)0x0);
            local_660 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_488);
            filename_01._M_str = local_660._8_8_;
            filename_01._M_len = (size_t)filename_01._M_str;
            _local_650 = wabt::GetBasename(local_660._0_8_,filename_01);
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                              (&s_write_c_options.module_name);
            if (bVar1) {
              s_write_c_options.module_name =
                   (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(module.loc.field_1.field2 + 8));
              local_670 = s_write_c_options.module_name;
              bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                (&s_write_c_options.module_name);
              if (bVar1) {
                local_6a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)&s_infile_abi_cxx11_);
                filename_02._M_str = local_6a0._8_8_;
                filename_02._M_len = (size_t)filename_02._M_str;
                local_690 = wabt::GetBasename(local_6a0._0_8_,filename_02);
                filename_03._M_str = local_690._M_str;
                filename_03._M_len = (size_t)filename_03._M_str;
                local_680 = wabt::StripExtension((wabt *)local_690._M_len,filename_03);
                s_write_c_options.module_name = local_680;
              }
            }
            if (s_num_outputs == 1) {
              ppSVar4 = std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::operator[]
                                  ((vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> *)
                                   &__range2,0);
              h_impl_stream_00 = *ppSVar4;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        (local_6c8,(basic_string_view<char,_std::char_traits<char>_> *)local_650,
                         (allocator<char> *)(header_impl_name_full.field_2._M_local_buf + 0xf));
              pcVar2 = (char *)std::__cxx11::string::c_str();
              local_6a4 = (Enum)wabt::WriteC((vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>
                                              *)&__range2,(Stream *)local_630,h_impl_stream_00,
                                             pcVar2,"",(Module *)local_410,&s_write_c_options);
              bVar1 = wabt::Failed((Result)local_6a4);
              std::__cxx11::string::~string(local_6c8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(header_impl_name_full.field_2._M_local_buf + 0xf));
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
                module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
              }
              else {
LAB_00133595:
                module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
              }
            }
            else {
              auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&s_outfile_abi_cxx11_);
              filename_04._M_str = auVar5._8_8_;
              filename_04._M_len = (size_t)filename_04._M_str;
              local_720 = wabt::StripExtension(auVar5._0_8_,filename_04);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&local_710,&local_720,
                         (allocator<char> *)&h_impl_stream.field_0x37);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6f0,&local_710,"-impl.h");
              std::__cxx11::string::~string((string *)&local_710);
              std::allocator<char>::~allocator((allocator<char> *)&h_impl_stream.field_0x37);
              sVar6 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_6f0);
              header_impl_name._M_str = (char *)sVar6._M_len;
              wabt::FileStream::FileStream((FileStream *)local_770,sVar6,(Stream *)0x0);
              local_7a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_6f0);
              filename_05._M_str = local_7a0._8_8_;
              filename_05._M_len = (size_t)filename_05._M_str;
              _local_790 = wabt::GetBasename(local_7a0._0_8_,filename_05);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        (local_7c8,(basic_string_view<char,_std::char_traits<char>_> *)local_650,
                         &local_7c9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        (local_7f0,(basic_string_view<char,_std::char_traits<char>_> *)local_790,
                         (allocator<char> *)&stream.field_0x37);
              header_impl_name_00 = (char *)std::__cxx11::string::c_str();
              local_7a4 = (Enum)wabt::WriteC((vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>
                                              *)&__range2,(Stream *)local_630,(Stream *)local_770,
                                             pcVar2,header_impl_name_00,(Module *)local_410,
                                             &s_write_c_options);
              bVar1 = wabt::Failed((Result)local_7a4);
              std::__cxx11::string::~string(local_7f0);
              std::allocator<char>::~allocator((allocator<char> *)&stream.field_0x37);
              std::__cxx11::string::~string(local_7c8);
              std::allocator<char>::~allocator(&local_7c9);
              if (bVar1) {
                wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
              }
              module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
              module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = bVar1;
              wabt::FileStream::~FileStream((FileStream *)local_770);
              std::__cxx11::string::~string((string *)local_6f0);
              if (module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0)
              goto LAB_00133595;
            }
            wabt::FileStream::~FileStream((FileStream *)local_630);
            std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::~vector
                      ((vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> *)&__range2);
            std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::~vector
                      ((vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> *)local_4e8);
            std::__cxx11::string::~string((string *)local_488);
          }
          else {
            wabt::FileStream::FileStream((FileStream *)local_830,_stdout,(Stream *)0x0);
            local_868 = (Stream *)local_830;
            local_860 = &local_868;
            local_858 = 1;
            std::allocator<wabt::Stream_*>::allocator(&local_869);
            __l._M_len = local_858;
            __l._M_array = local_860;
            std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::vector
                      (&local_850,__l,&local_869);
            local_834 = (Enum)wabt::WriteC(&local_850,(Stream *)local_830,(Stream *)local_830,
                                           "wasm.h","",(Module *)local_410,&s_write_c_options);
            bVar1 = wabt::Failed((Result)local_834);
            std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::~vector(&local_850);
            std::allocator<wabt::Stream_*>::~allocator(&local_869);
            if (bVar1) {
              wabt::Result::Result((Result *)((long)&errors_local + 4),Error);
            }
            module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
            module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = bVar1;
            wabt::FileStream::~FileStream((FileStream *)local_830);
          }
          if (module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
            wabt::Result::Result((Result *)((long)&errors_local + 4),Ok);
            module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
          }
        }
      }
    }
    wabt::Module::~Module((Module *)local_410);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
LAB_0013371d:
  return (Result)errors_local._4_4_;
}

Assistant:

Result Wasm2cMain(Errors& errors) {
  if (s_num_outputs < 1) {
    fprintf(stderr, "Number of output files must be positive.\n");
    return Result::Error;
  }

  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(s_infile.c_str(), &file_data));

  Module module;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_write_c_options.features, s_log_stream.get(),
                            s_read_debug_names, kStopOnFirstError,
                            kFailOnCustomSectionError);
  CHECK_RESULT(ReadBinaryIr(s_infile.c_str(), file_data.data(),
                            file_data.size(), options, &errors, &module));
  CHECK_RESULT(ValidateModule(&module, &errors, s_write_c_options.features));
  CHECK_RESULT(GenerateNames(&module));
  /* TODO(binji): This shouldn't fail; if a name can't be applied
   * (because the index is invalid, say) it should just be skipped. */
  ApplyNames(&module);

  if (!s_outfile.empty()) {
    std::string header_name_full =
        std::string(wabt::StripExtension(s_outfile)) + ".h";
    std::vector<FileStream> c_streams;
    if (s_num_outputs == 1) {
      c_streams.emplace_back(s_outfile.c_str());
    } else {
      std::string output_prefix{wabt::StripExtension(s_outfile)};
      for (unsigned int i = 0; i < s_num_outputs; i++) {
        c_streams.emplace_back(output_prefix + "_" + std::to_string(i) + ".c");
      }
    }
    std::vector<Stream*> c_stream_ptrs;
    for (auto& s : c_streams) {
      c_stream_ptrs.emplace_back(&s);
    }
    FileStream h_stream(header_name_full);
    std::string_view header_name = GetBasename(header_name_full);
    if (s_write_c_options.module_name.empty()) {
      s_write_c_options.module_name = module.name;
      if (s_write_c_options.module_name.empty()) {
        // In the absence of module name in the names section use the filename.
        s_write_c_options.module_name = StripExtension(GetBasename(s_infile));
      }
    }
    if (s_num_outputs == 1) {
      CHECK_RESULT(WriteC(std::move(c_stream_ptrs), &h_stream, c_stream_ptrs[0],
                          std::string(header_name).c_str(), "", &module,
                          s_write_c_options));
    } else {
      std::string header_impl_name_full =
          std::string(wabt::StripExtension(s_outfile)) + "-impl.h";
      FileStream h_impl_stream(header_impl_name_full);
      std::string_view header_impl_name = GetBasename(header_impl_name_full);
      CHECK_RESULT(WriteC(std::move(c_stream_ptrs), &h_stream, &h_impl_stream,
                          std::string(header_name).c_str(),
                          std::string(header_impl_name).c_str(), &module,
                          s_write_c_options));
    }
  } else {
    FileStream stream(stdout);
    CHECK_RESULT(WriteC({&stream}, &stream, &stream, "wasm.h", "", &module,
                        s_write_c_options));
  }

  return Result::Ok;
}